

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.hxx
# Opt level: O0

void __thiscall
DisplayAction::DisplayAction
          (DisplayAction *this,int n,string *s,offset_in_Display_to_subr sa,
          offset_in_Display_to_subr sn,offset_in_Display_to_subr ss)

{
  offset_in_Display_to_subr in_stack_00000008;
  undefined8 in_stack_00000010;
  offset_in_Display_to_subr in_stack_00000018;
  undefined8 in_stack_00000020;
  offset_in_Display_to_subr ss_local;
  offset_in_Display_to_subr sn_local;
  offset_in_Display_to_subr sa_local;
  string *s_local;
  int n_local;
  DisplayAction *this_local;
  
  std::__cxx11::string::string((string *)&this->sString);
  this->nInt = n;
  std::__cxx11::string::operator=((string *)&this->sString,(string *)s);
  *(offset_in_Display_to_subr *)&this->field_0x30 = sn;
  this->action = sa;
  *(undefined8 *)&this->field_0x40 = in_stack_00000010;
  this->setInt = in_stack_00000008;
  *(undefined8 *)&this->field_0x50 = in_stack_00000020;
  this->setString = in_stack_00000018;
  return;
}

Assistant:

DisplayAction(
		int n, 
		string s, 
		void (Display::* sa)(), 
		void (Display::* sn)(const int &), 
		void (Display::* ss)(string)
	) {
		nInt = n;
		sString = s;
		action = sa;
		setInt = sn;
		setString = ss;
	}